

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForbiddenPointFinder.cpp
# Opt level: O3

bool __thiscall
ForbiddenPointFinder::isFour(ForbiddenPointFinder *this,int x,int y,int nColor,int nDir)

{
  Stone SVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  Stone *pSVar6;
  Stone (*paSVar7) [17];
  int iVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  Stone *pSVar15;
  Stone SVar16;
  int iVar17;
  
  lVar4 = (long)x;
  lVar10 = (long)y;
  if (this->cBoard[lVar4 + 1][lVar10 + 1] != Empty) {
    return false;
  }
  bVar2 = isFive(this,x,y,nColor);
  if (bVar2) {
    return false;
  }
  if (nColor == 1) {
    SVar16 = White;
  }
  else {
    if (nColor != 0) {
      return false;
    }
    bVar2 = isOverline(this,x,y);
    SVar16 = Black;
    if (bVar2) {
      return false;
    }
  }
  pSVar15 = this->cBoard[lVar4 + 1] + lVar10 + 1;
  *pSVar15 = SVar16;
  if (nDir - 1U < 4) {
    iVar11 = x + 1;
    iVar17 = y + 1;
    switch(nDir) {
    case 1:
      uVar13 = x;
      if (0 < x) {
        do {
          SVar1 = this->cBoard[uVar13][lVar10 + 1];
          if (SVar1 != SVar16) {
            if (SVar1 == Empty) {
              bVar2 = isFive(this,uVar13 - 1,y,0,1);
              bVar3 = true;
              if (bVar2) goto LAB_00103862;
            }
            break;
          }
          bVar2 = 1 < (int)uVar13;
          uVar13 = uVar13 - 1;
        } while (bVar2);
        if (0xd < x) break;
      }
      lVar4 = (long)(x + 2);
      pSVar6 = this->cBoard[lVar4] + lVar10 + 1;
LAB_00103607:
      x = x + 1;
      lVar4 = lVar4 + 1;
      if (*pSVar6 == SVar16) goto code_r0x0010360e;
      if (*pSVar6 == Empty) {
        iVar8 = 1;
LAB_0010384d:
        bVar2 = isFive(this,x,y,0,iVar8);
        bVar3 = true;
        if (bVar2) goto LAB_00103862;
      }
      break;
    case 2:
      if (0 < y) {
        uVar9 = (ulong)(uint)y;
        do {
          iVar11 = (int)uVar9;
          SVar1 = this->cBoard[lVar4 + 1][uVar9];
          if (SVar1 != SVar16) {
            if (SVar1 == Empty) {
              bVar2 = isFive(this,x,iVar11 + -1,0,2);
              bVar3 = true;
              if (bVar2) goto LAB_00103862;
            }
            break;
          }
          uVar9 = (ulong)(iVar11 - 1);
        } while (1 < iVar11);
        if (0xd < y) break;
      }
      lVar10 = (long)(y + 2) + 0x1c5;
      do {
        SVar1 = *(Stone *)((long)this->ptForbidden + lVar10 * 4 + lVar4 * 0x44 + 0x38);
        if (SVar1 != SVar16) {
          if (SVar1 == Empty) {
            iVar8 = 2;
            y = iVar17;
            goto LAB_0010384d;
          }
          break;
        }
        iVar17 = iVar17 + 1;
        iVar11 = (int)lVar10;
        lVar10 = lVar10 + 1;
      } while (iVar11 != 0x1d4);
      break;
    case 3:
      if (0 < y && 0 < x) {
        uVar9 = (ulong)(uint)y;
        uVar14 = (ulong)(uint)x;
        do {
          iVar12 = (int)uVar14;
          iVar8 = (int)uVar9;
          SVar1 = this->cBoard[uVar14][uVar9];
          if (SVar1 != SVar16) {
            if (SVar1 == Empty) {
              bVar2 = isFive(this,iVar12 + -1,iVar8 + -1,0,3);
              bVar3 = true;
              if (bVar2) goto LAB_00103862;
            }
            break;
          }
          if (iVar12 < 2) break;
          uVar14 = (ulong)(iVar12 - 1);
          uVar9 = (ulong)(iVar8 - 1);
        } while (1 < iVar8);
      }
      if (y < 0xe && x < 0xe) {
        lVar5 = (long)(x + 2);
        pSVar6 = this->cBoard[lVar5] + lVar10 + 2;
        lVar4 = lVar10 + 2;
        do {
          if (*pSVar6 != SVar16) {
            if (*pSVar6 == Empty) {
              iVar8 = 3;
              y = iVar17;
              x = iVar11;
              goto LAB_0010384d;
            }
            break;
          }
          if (0xe < lVar5) break;
          lVar5 = lVar5 + 1;
          iVar11 = iVar11 + 1;
          pSVar6 = pSVar6 + 0x12;
          iVar17 = iVar17 + 1;
          bVar2 = lVar4 < 0xf;
          lVar4 = lVar4 + 1;
        } while (bVar2);
      }
      break;
    case 4:
      if (y < 0xe && 0 < x) {
        lVar4 = 0;
        uVar13 = x;
        do {
          SVar1 = this->cBoard[uVar13][lVar10 + lVar4 + 2];
          if (SVar1 != SVar16) {
            if (SVar1 == Empty) {
              bVar2 = isFive(this,~(uint)lVar4 + x,y + 1 + (uint)lVar4,0,4);
              bVar3 = true;
              if (bVar2) goto LAB_00103862;
            }
            break;
          }
          if ((int)uVar13 < 2) break;
          lVar5 = lVar10 + 2 + lVar4;
          uVar13 = uVar13 - 1;
          lVar4 = lVar4 + 1;
        } while (lVar5 < 0xf);
      }
      if (0 < y && x < 0xe) {
        lVar4 = (long)(x + 2);
        paSVar7 = this->cBoard + lVar4;
        do {
          if ((*paSVar7)[(uint)y] != SVar16) {
            if ((*paSVar7)[(uint)y] == Empty) {
              iVar8 = 4;
              y = y - 1;
              x = iVar11;
              goto LAB_0010384d;
            }
            break;
          }
          if (0xe < lVar4) break;
          lVar4 = lVar4 + 1;
          iVar11 = iVar11 + 1;
          paSVar7 = paSVar7 + 1;
          bVar2 = 1 < y;
          y = y - 1;
        } while (bVar2);
      }
    }
  }
LAB_00103860:
  bVar3 = false;
LAB_00103862:
  *pSVar15 = Empty;
  return bVar3;
code_r0x0010360e:
  pSVar6 = pSVar6 + 0x11;
  if ((int)lVar4 == 0x10) goto LAB_00103860;
  goto LAB_00103607;
}

Assistant:

bool ForbiddenPointFinder::isFour(int x, int y, int nColor, int nDir) {
    if (cBoard[x + 1][y + 1] != Stone::Empty)
        return false;

    if (isFive(x, y, nColor))    // five?
        return false;
    else if ((nColor == 0) && (isOverline(x, y)))    // black overline?
        return false;
    else {
        Stone c;
        if (nColor == 0)    // black
            c = Stone::Black;
        else if (nColor == 1)    // white
            c = Stone::White;
        else
            return false;

        setStone(x, y, c);

        int i, j;

        switch (nDir) {
            case 1:        // horizontal direction
                i = x;
                while (i > 0) {
                    if (cBoard[i][y + 1] == c) {
                        i--;
                        continue;
                    } else if (cBoard[i][y + 1] == Stone::Empty) {
                        if (isFive(i - 1, y, 0, nDir)) {
                            setStone(x, y, Stone::Empty);
                            return true;
                        } else
                            break;
                    } else
                        break;
                }
                i = x + 2;
                while (i < (BoardSize + 1)) {
                    if (cBoard[i][y + 1] == c) {
                        i++;
                        continue;
                    } else if (cBoard[i][y + 1] == Stone::Empty) {
                        if (isFive(i - 1, y, 0, nDir)) {
                            setStone(x, y, Stone::Empty);
                            return true;
                        } else
                            break;
                    } else
                        break;
                }
                setStone(x, y, Stone::Empty);
                return false;
                break;
            case 2:        // vertial direction
                i = y;
                while (i > 0) {
                    if (cBoard[x + 1][i] == c) {
                        i--;
                        continue;
                    } else if (cBoard[x + 1][i] == Stone::Empty) {
                        if (isFive(x, i - 1, 0, nDir)) {
                            setStone(x, y, Stone::Empty);
                            return true;
                        } else
                            break;
                    } else
                        break;
                }
                i = y + 2;
                while (i < (BoardSize + 1)) {
                    if (cBoard[x + 1][i] == c) {
                        i++;
                        continue;
                    } else if (cBoard[x + 1][i] == Stone::Empty) {
                        if (isFive(x, i - 1, 0, nDir)) {
                            setStone(x, y, Stone::Empty);
                            return true;
                        } else
                            break;
                    } else
                        break;
                }
                setStone(x, y, Stone::Empty);
                return false;
                break;
            case 3:        // diagonal direction - '/'
                i = x;
                j = y;
                while ((i > 0) && (j > 0)) {
                    if (cBoard[i][j] == c) {
                        i--;
                        j--;
                        continue;
                    } else if (cBoard[i][j] == Stone::Empty) {
                        if (isFive(i - 1, j - 1, 0, nDir)) {
                            setStone(x, y, Stone::Empty);
                            return true;
                        } else
                            break;
                    } else
                        break;
                }
                i = x + 2;
                j = y + 2;
                while ((i < (BoardSize + 1)) && (j < (BoardSize + 1))) {
                    if (cBoard[i][j] == c) {
                        i++;
                        j++;
                        continue;
                    } else if (cBoard[i][j] == Stone::Empty) {
                        if (isFive(i - 1, j - 1, 0, nDir)) {
                            setStone(x, y, Stone::Empty);
                            return true;
                        } else
                            break;
                    } else
                        break;
                }
                setStone(x, y, Stone::Empty);
                return false;
                break;
            case 4:        // diagonal direction - '\'
                i = x;
                j = y + 2;
                while ((i > 0) && (j < (BoardSize + 1))) {
                    if (cBoard[i][j] == c) {
                        i--;
                        j++;
                        continue;
                    } else if (cBoard[i][j] == Stone::Empty) {
                        if (isFive(i - 1, j - 1, 0, nDir)) {
                            setStone(x, y, Stone::Empty);
                            return true;
                        } else
                            break;
                    } else
                        break;
                }
                i = x + 2;
                j = y;
                while ((i < (BoardSize + 1)) && (j > 0)) {
                    if (cBoard[i][j] == c) {
                        i++;
                        j--;
                        continue;
                    } else if (cBoard[i][j] == Stone::Empty) {
                        if (isFive(i - 1, j - 1, 0, nDir)) {
                            setStone(x, y, Stone::Empty);
                            return true;
                        } else
                            break;
                    } else
                        break;
                }
                setStone(x, y, Stone::Empty);
                return false;
                break;
            default:
                setStone(x, y, Stone::Empty);
                return false;
                break;
        }
    }
}